

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

_tExecReaction __thiscall yactfr::internal::Vm::_execSetPktTotalLen(Vm *this,Instr *param_1)

{
  ulong expectedLen;
  ExpectedPacketTotalLengthNotMultipleOf8DecodingError *this_00;
  Index IVar1;
  ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError *this_01;
  ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError *this_02;
  uint64_t pktTotalSizeCandidateBits;
  Instr *param_1_local;
  Vm *this_local;
  
  expectedLen = (this->_pos).lastIntVal.u;
  if ((expectedLen & 7) != 0) {
    this_00 = (ExpectedPacketTotalLengthNotMultipleOf8DecodingError *)__cxa_allocate_exception(0x40)
    ;
    IVar1 = VmPos::headOffsetInElemSeqBits(&this->_pos);
    ExpectedPacketTotalLengthNotMultipleOf8DecodingError::
    ExpectedPacketTotalLengthNotMultipleOf8DecodingError(this_00,IVar1,expectedLen);
    __cxa_throw(this_00,&ExpectedPacketTotalLengthNotMultipleOf8DecodingError::typeinfo,
                ExpectedPacketTotalLengthNotMultipleOf8DecodingError::
                ~ExpectedPacketTotalLengthNotMultipleOf8DecodingError);
  }
  if (((this->_pos).curExpectedPktContentLenBits != 0xffffffffffffffff) &&
     (expectedLen < (this->_pos).curExpectedPktContentLenBits)) {
    this_01 = (ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError *)
              __cxa_allocate_exception(0x48);
    IVar1 = VmPos::headOffsetInElemSeqBits(&this->_pos);
    ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError::
    ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError
              (this_01,IVar1,expectedLen,(this->_pos).curExpectedPktContentLenBits);
    __cxa_throw(this_01,&ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError::
                         typeinfo,
                ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError::
                ~ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError);
  }
  if ((this->_pos).headOffsetInCurPktBits <= expectedLen) {
    (this->_pos).curExpectedPktTotalLenBits = expectedLen;
    if ((this->_pos).curExpectedPktContentLenBits == 0xffffffffffffffff) {
      (this->_pos).curExpectedPktContentLenBits = (this->_pos).curExpectedPktTotalLenBits;
    }
    return ExecNextInstr;
  }
  this_02 = (ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError *)
            __cxa_allocate_exception(0x48);
  IVar1 = VmPos::headOffsetInElemSeqBits(&this->_pos);
  ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError::
  ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError
            (this_02,IVar1,expectedLen,(this->_pos).headOffsetInCurPktBits);
  __cxa_throw(this_02,&ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError::typeinfo,
              ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError::
              ~ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError);
}

Assistant:

Vm::_tExecReaction Vm::_execSetPktTotalLen(const Instr&)
{
    const auto pktTotalSizeCandidateBits = _pos.lastIntVal.u;

    if ((pktTotalSizeCandidateBits & 7) != 0) {
        throw ExpectedPacketTotalLengthNotMultipleOf8DecodingError {
            _pos.headOffsetInElemSeqBits(),
            pktTotalSizeCandidateBits
        };
    }

    if (_pos.curExpectedPktContentLenBits != sizeUnset) {
        if (pktTotalSizeCandidateBits < _pos.curExpectedPktContentLenBits) {
            throw ExpectedPacketTotalLengthLessThanExpectedPacketContentLengthDecodingError {
                _pos.headOffsetInElemSeqBits(),
                pktTotalSizeCandidateBits,
                _pos.curExpectedPktContentLenBits
            };
        }
    }

    if (pktTotalSizeCandidateBits < _pos.headOffsetInCurPktBits) {
        throw ExpectedPacketTotalLengthLessThanOffsetInPacketDecodingError {
            _pos.headOffsetInElemSeqBits(),
            pktTotalSizeCandidateBits,
            _pos.headOffsetInCurPktBits
        };
    }

    _pos.curExpectedPktTotalLenBits = pktTotalSizeCandidateBits;

    if (_pos.curExpectedPktContentLenBits == sizeUnset) {
        _pos.curExpectedPktContentLenBits = _pos.curExpectedPktTotalLenBits;
    }

    return _tExecReaction::ExecNextInstr;
}